

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AuxPtrs.h
# Opt level: O3

void Js::AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType>::SetAuxPtr
               (FunctionProxy *host,AuxPointerType e,void *ptr)

{
  code *pcVar1;
  long lVar2;
  Type TVar3;
  bool bVar4;
  byte bVar5;
  undefined4 *puVar6;
  long lVar7;
  uint lineNumber;
  Type *addr;
  AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType> *pAVar8;
  Type *addr_00;
  
  pAVar8 = (host->auxPtrs).ptr;
  if (pAVar8 == (AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType> *)0x0) {
    AllocAuxPtrFix(host,'\x10');
    pAVar8 = (host->auxPtrs).ptr;
    if (pAVar8->count != '\x01') {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/AuxPtrs.h"
                                  ,0x67,"(count == _MaxCount)","count == _MaxCount");
      if (!bVar4) goto LAB_007758e6;
      *puVar6 = 0;
    }
    if (pAVar8->capacity == e || pAVar8->capacity == Invalid) {
      Memory::Recycler::WBSetBit((char *)(pAVar8->offsets + 6));
      *(void **)(pAVar8->offsets + 6) = ptr;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(pAVar8->offsets + 6);
      pAVar8->capacity = e;
      return;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    lineNumber = 0xe6;
LAB_00775794:
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/AuxPtrs.h"
                                ,lineNumber,"(ret)","ret");
    if (bVar4) {
      *puVar6 = 0;
      return;
    }
LAB_007758e6:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  TVar3 = pAVar8->count;
  if (TVar3 == '\x01') {
    if (pAVar8->capacity == Invalid || pAVar8->capacity == e) goto LAB_0077568d;
    AllocAuxPtrFix(host,' ');
    pAVar8 = (host->auxPtrs).ptr;
    TVar3 = pAVar8->count;
  }
  if (TVar3 == '\x03') {
    if (pAVar8->capacity == Invalid || pAVar8->capacity == e) {
LAB_0077568d:
      Memory::Recycler::WBSetBit((char *)(pAVar8->offsets + 6));
      *(void **)(pAVar8->offsets + 6) = ptr;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(pAVar8->offsets + 6);
      pAVar8->capacity = e;
      return;
    }
    addr = pAVar8->offsets + 6;
    lVar2 = 0;
    while (lVar7 = lVar2, lVar7 != 2) {
      addr = addr + 8;
      if ((pAVar8->offsets[lVar7] == e) || (lVar2 = lVar7 + 1, pAVar8->offsets[lVar7] == Invalid)) {
        Memory::Recycler::WBSetBit((char *)addr);
        *(void **)addr = ptr;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
        pAVar8->offsets[lVar7] = e;
        return;
      }
    }
    AllocAuxPtr(host,'\x04');
    pAVar8 = (host->auxPtrs).ptr;
  }
  bVar5 = pAVar8->offsets[e];
  if (bVar5 == 0xff) {
    bVar5 = pAVar8->count;
    if (bVar5 == pAVar8->capacity) {
      AllocAuxPtr(host,bVar5 + 1);
      pAVar8 = (host->auxPtrs).ptr;
      bVar5 = pAVar8->offsets[e];
      if (bVar5 == 0xff) {
        bVar5 = pAVar8->count;
        if (bVar5 == pAVar8->capacity) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar6 = 1;
          lineNumber = 0x107;
          goto LAB_00775794;
        }
        pAVar8->count = bVar5 + 1;
        pAVar8->offsets[e] = bVar5;
      }
      addr_00 = pAVar8->ptrs + bVar5;
      goto LAB_007758ae;
    }
    pAVar8->count = bVar5 + 1;
    pAVar8->offsets[e] = bVar5;
  }
  addr_00 = pAVar8->ptrs + bVar5;
LAB_007758ae:
  Memory::Recycler::WBSetBit((char *)addr_00);
  addr_00->ptr = ptr;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_00);
  return;
}

Assistant:

void AuxPtrs<T, FieldsEnum>::SetAuxPtr(T* host, FieldsEnum e, void* ptr)
    {

        if (host->auxPtrs == nullptr)
        {
            AuxPtrs<FunctionProxy, FieldsEnum>::AllocAuxPtrFix(host, 16);
            bool ret = ((AuxPtrs16*)(void*)host->auxPtrs)->Set(e, ptr);
            Assert(ret);
            return;
        }
        if (host->auxPtrs->count == AuxPtrs16::MaxCount)
        {
            bool ret = ((AuxPtrs16*)(void*)host->auxPtrs)->Set(e, ptr);
            if (ret)
            {
                return;
            }
            else
            {
                AuxPtrs<FunctionProxy, FieldsEnum>::AllocAuxPtrFix(host, 32);
            }
        }
        if (host->auxPtrs->count == AuxPtrs32::MaxCount)
        {
            bool ret = ((AuxPtrs32*)(void*)host->auxPtrs)->Set(e, ptr);
            if (ret)
            {
                return;
            }
            else
            {
                AuxPtrs<FunctionProxy, FieldsEnum>::AllocAuxPtr(host, AuxPtrs32::MaxCount + 1);
            }
        }

        bool ret = host->auxPtrs->Set(e, ptr);
        if (!ret)
        {
            AuxPtrs<FunctionProxy, FieldsEnum>::AllocAuxPtr(host, host->auxPtrs->count + 1);
            ret = host->auxPtrs->Set(e, ptr);
            Assert(ret);
        }
    }